

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

void Amap_ManPrintCuts(Amap_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  int local_20;
  uint local_1c;
  int i;
  int c;
  Amap_Cut_t *pCut;
  Amap_Obj_t *pNode_local;
  
  printf("NODE %5d : Type = ",(ulong)((uint)(*(ulong *)pNode >> 3) & 0x1fffffff));
  if (((uint)*(undefined8 *)pNode & 7) == 4) {
    printf("AND");
  }
  else if (((uint)*(undefined8 *)pNode & 7) == 5) {
    printf("XOR");
  }
  else if (((uint)*(undefined8 *)pNode & 7) == 6) {
    printf("MUX");
  }
  printf("  Cuts = %d\n",(ulong)(*(uint *)&pNode->field_0x8 >> 0xc));
  local_1c = 0;
  _i = (Amap_Cut_t *)(pNode->field_11).pData;
  while ((int)local_1c < (int)(*(uint *)&pNode->field_0x8 >> 0xc)) {
    printf("%3d :  Mat= %3d  Inv=%d  ",(ulong)local_1c,(ulong)((uint)*_i & 0xffff),
           (ulong)((uint)*_i >> 0x10 & 1));
    for (local_20 = 0; local_20 < (int)((uint)*_i >> 0x11); local_20 = local_20 + 1) {
      uVar1 = Abc_Lit2Var((int)_i[(long)local_20 + 1]);
      iVar2 = Abc_LitIsCompl((int)_i[(long)local_20 + 1]);
      uVar3 = 0x2b;
      if (iVar2 != 0) {
        uVar3 = 0x2d;
      }
      printf("%d%c ",(ulong)uVar1,uVar3);
    }
    printf("\n");
    local_1c = local_1c + 1;
    _i = Amap_ManCutNext(_i);
  }
  return;
}

Assistant:

void Amap_ManPrintCuts( Amap_Obj_t * pNode )
{
    Amap_Cut_t * pCut;
    int c, i;
    printf( "NODE %5d : Type = ", pNode->Id );
    if ( pNode->Type == AMAP_OBJ_AND )
        printf( "AND" );
    else if ( pNode->Type == AMAP_OBJ_XOR )
        printf( "XOR" );
    else if ( pNode->Type == AMAP_OBJ_MUX )
        printf( "MUX" );
    printf( "  Cuts = %d\n", pNode->nCuts );
    Amap_NodeForEachCut( pNode, pCut, c )
    {
        printf( "%3d :  Mat= %3d  Inv=%d  ", c, pCut->iMat, pCut->fInv );
        for ( i = 0; i < (int)pCut->nFans; i++ )
            printf( "%d%c ", Abc_Lit2Var(pCut->Fans[i]), Abc_LitIsCompl(pCut->Fans[i])?'-':'+' );
        printf( "\n" );
    }
}